

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O0

void Imf_3_4::
     GetChannelsInMultiPartFile<std::vector<Imf_3_4::MultiViewChannelName,std::allocator<Imf_3_4::MultiViewChannelName>>>
               (MultiPartInputFile *file,
               vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
               *chans)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Header *pHVar4;
  string *psVar5;
  undefined8 in_RDI;
  MultiViewChannelName m;
  ConstIterator i;
  string view;
  ChannelList *c;
  int p;
  StringVector mview;
  bool has_multiview;
  ConstIterator *in_stack_fffffffffffffde8;
  MultiViewChannelName *in_stack_fffffffffffffdf0;
  value_type *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe90;
  string local_150 [32];
  undefined1 local_130 [40];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  int local_a8;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined8 local_78;
  allocator<char> local_69;
  string local_68 [32];
  undefined8 local_48;
  int local_40;
  byte local_11;
  undefined8 local_8;
  
  local_11 = 0;
  local_8 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10c45c);
  iVar2 = Imf_3_4::MultiPartInputFile::parts();
  if (iVar2 == 1) {
    pHVar4 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_8);
    bVar1 = Imf_3_4::hasMultiView(pHVar4);
    if ((bVar1 & 1) != 0) {
      pHVar4 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_8);
      Imf_3_4::multiView_abi_cxx11_(pHVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(bVar1,in_stack_fffffffffffffe90),
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pHVar4);
      local_11 = 1;
    }
  }
  for (local_40 = 0; iVar2 = local_40, iVar3 = Imf_3_4::MultiPartInputFile::parts(), iVar2 < iVar3;
      local_40 = local_40 + 1) {
    Imf_3_4::MultiPartInputFile::header((int)local_8);
    local_48 = Imf_3_4::Header::channels();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe30,
               (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
               in_stack_fffffffffffffe20);
    std::allocator<char>::~allocator(&local_69);
    Imf_3_4::MultiPartInputFile::header((int)local_8);
    bVar1 = Imf_3_4::Header::hasView();
    if ((bVar1 & 1) != 0) {
      Imf_3_4::MultiPartInputFile::header((int)local_8);
      psVar5 = (string *)Imf_3_4::Header::view_abi_cxx11_();
      std::__cxx11::string::operator=(local_68,psVar5);
    }
    local_78 = Imf_3_4::ChannelList::begin();
    while( true ) {
      in_stack_fffffffffffffe30 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Imf_3_4::ChannelList::end();
      local_80 = in_stack_fffffffffffffe30;
      in_stack_fffffffffffffe2f =
           operator!=((ConstIterator *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      if (!(bool)in_stack_fffffffffffffe2f) break;
      MultiViewChannelName::MultiViewChannelName(in_stack_fffffffffffffdf0);
      in_stack_fffffffffffffe20 =
           (allocator<char> *)ChannelList::ConstIterator::name((ConstIterator *)0x10c72b);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe30,
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe20);
      std::__cxx11::string::operator=(local_e8,local_108);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)(local_130 + 0x27));
      std::__cxx11::string::operator=(local_a0,local_e8);
      if ((local_11 & 1) == 0) {
        std::__cxx11::string::operator=(local_c8,local_68);
      }
      else {
        Imf_3_4::viewFromChannelName((string *)local_130,(vector *)local_e8);
        in_stack_fffffffffffffe00 = local_c8;
        in_stack_fffffffffffffdf8 = (value_type *)local_130;
        std::__cxx11::string::operator=
                  (in_stack_fffffffffffffe00,(string *)in_stack_fffffffffffffdf8);
        std::__cxx11::string::~string((string *)in_stack_fffffffffffffdf8);
        Imf_3_4::removeViewName(local_150,local_a0);
        std::__cxx11::string::operator=(local_e8,local_150);
        std::__cxx11::string::~string(local_150);
      }
      local_a8 = local_40;
      std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
      push_back((vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                 *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      MultiViewChannelName::~MultiViewChannelName(in_stack_fffffffffffffdf0);
      in_stack_fffffffffffffdf0 =
           (MultiViewChannelName *)
           ChannelList::ConstIterator::operator++(in_stack_fffffffffffffde8,0);
    }
    std::__cxx11::string::~string(local_68);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe00);
  return;
}

Assistant:

inline void
GetChannelsInMultiPartFile (const MultiPartInputFile& file, T& chans)
{
    bool         has_multiview = false;
    StringVector mview;
    if (file.parts () == 1)
    {
        if (hasMultiView (file.header (0)))
        {
            mview         = multiView (file.header (0));
            has_multiview = true;
        }
    }

    for (int p = 0; p < file.parts (); p++)
    {
        const ChannelList& c = file.header (p).channels ();

        std::string view = "";
        if (file.header (p).hasView ()) { view = file.header (p).view (); }
        for (ChannelList::ConstIterator i = c.begin (); i != c.end (); i++)
        {
            MultiViewChannelName m;
            m.name          = std::string (i.name ());
            m.internal_name = m.name;

            if (has_multiview)
            {
                m.view = viewFromChannelName (m.name, mview);
                m.name = removeViewName (m.internal_name, m.view);
            }
            else { m.view = view; }
            m.part_number = p;
            chans.push_back (m);
        }
    }
}